

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.cpp
# Opt level: O0

void __thiscall BaseComponent::BaseComponent(BaseComponent *this)

{
  queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_> *in_RDI;
  BaseStoppable *in_stack_fffffffffffffff0;
  
  BaseStoppable::BaseStoppable(in_stack_fffffffffffffff0);
  (in_RDI->c).super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)&PTR_Run_00115ba8;
  std::queue<Event*,std::deque<Event*,std::allocator<Event*>>>::
  queue<std::deque<Event*,std::allocator<Event*>>,void>(in_RDI);
  std::mutex::mutex((mutex *)0x108343);
  return;
}

Assistant:

BaseComponent::BaseComponent() :
    BaseStoppable() {}